

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedMeshControl.cpp
# Opt level: O3

void __thiscall TPZMHMixedMeshControl::BuildMultiPhysicsMesh(TPZMHMixedMeshControl *this)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Rb_tree_color _Var3;
  TPZCompMesh *pTVar4;
  long lVar5;
  TPZCompEl *pTVar6;
  _Base_ptr p_Var7;
  TPZCompEl **ppTVar8;
  TPZGeoEl *pTVar9;
  TPZGeoEl **ppTVar10;
  _Base_ptr p_Var11;
  _Rb_tree_header *p_Var12;
  _Base_ptr p_Var13;
  _Base_ptr p_Var14;
  long lVar15;
  set<int,_std::less<int>,_std::allocator<int>_> matids;
  TPZManVector<TPZCompMesh_*,_10> meshvec;
  TPZStack<long,_10> gelindexes;
  TPZManVector<long,_10> shouldcreate;
  TPZMultiphysicsCompMesh *local_1c0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_1b8;
  TPZManVector<TPZCompMesh_*,_10> local_188;
  TPZManVector<long,_10> local_118;
  TPZManVector<long,_10> local_a0;
  
  pTVar4 = ((this->super_TPZMHMeshControl).fCMesh.fRef)->fPointer;
  if ((pTVar4->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements != 0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMixedMeshControl.cpp"
               ,0x546);
  }
  TPZCreateApproximationSpace::SetAllCreateFunctionsMultiphysicElem(&pTVar4->fCreate);
  pTVar4 = ((this->super_TPZMHMeshControl).fCMesh.fRef)->fPointer;
  if (pTVar4 == (TPZCompMesh *)0x0) {
    local_1c0 = (TPZMultiphysicsCompMesh *)0x0;
  }
  else {
    local_1c0 = (TPZMultiphysicsCompMesh *)
                __dynamic_cast(pTVar4,&TPZCompMesh::typeinfo,&TPZMultiphysicsCompMesh::typeinfo,0);
  }
  TPZManVector<TPZCompMesh_*,_10>::TPZManVector
            (&local_188,(ulong)((this->super_TPZMHMeshControl).fNState < 2) ^ 3);
  *local_188.super_TPZVec<TPZCompMesh_*>.fStore = ((this->fFluxMesh).fRef)->fPointer;
  local_188.super_TPZVec<TPZCompMesh_*>.fStore[1] =
       ((this->super_TPZMHMeshControl).fPressureFineMesh.fRef)->fPointer;
  if (1 < (this->super_TPZMHMeshControl).fNState) {
    local_188.super_TPZVec<TPZCompMesh_*>.fStore[2] = ((this->fRotationMesh).fRef)->fPointer;
  }
  local_118.super_TPZVec<long>._vptr_TPZVec = (_func_int **)0x0;
  TPZManVector<long,_10>::TPZManVector
            (&local_a0,
             (((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer->fElementVec).
             super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements,(long *)&local_118);
  p_Var1 = &local_1b8._M_impl.super__Rb_tree_header;
  local_1b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  pTVar4 = ((this->super_TPZMHMeshControl).fCMesh.fRef)->fPointer;
  p_Var7 = (pTVar4->fMaterialVec)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var12 = &(pTVar4->fMaterialVec)._M_t._M_impl.super__Rb_tree_header;
  local_1b8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_1b8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if ((_Rb_tree_header *)p_Var7 != p_Var12) {
    do {
      local_118.super_TPZVec<long>._vptr_TPZVec = *(_func_int ***)(p_Var7 + 1);
      local_118.super_TPZVec<long>.fStore = (long *)p_Var7[1]._M_parent;
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_1b8,(int *)&local_118);
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var12);
  }
  lVar5 = (((this->fFluxMesh).fRef)->fPointer->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.
          fNElements;
  if (0 < lVar5) {
    lVar15 = 0;
    do {
      ppTVar8 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(((this->fFluxMesh).fRef)->fPointer->fElementVec).
                            super_TPZChunkVector<TPZCompEl_*,_10>,lVar15);
      pTVar6 = *ppTVar8;
      pTVar9 = TPZCompEl::Reference(pTVar6);
      if (local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_01448c9d:
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMixedMeshControl.cpp"
                   ,0x55e);
      }
      iVar2 = pTVar9->fMatId;
      p_Var7 = local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var14 = &p_Var1->_M_header;
      do {
        p_Var13 = p_Var14;
        p_Var11 = p_Var7;
        _Var3 = p_Var11[1]._M_color;
        p_Var14 = p_Var11;
        if ((int)_Var3 < iVar2) {
          p_Var14 = p_Var13;
        }
        p_Var7 = (&p_Var11->_M_left)[(int)_Var3 < iVar2];
      } while ((&p_Var11->_M_left)[(int)_Var3 < iVar2] != (_Base_ptr)0x0);
      if ((_Rb_tree_header *)p_Var14 == p_Var1) goto LAB_01448c9d;
      if ((int)_Var3 < iVar2) {
        p_Var11 = p_Var13;
      }
      if (iVar2 < (int)p_Var11[1]._M_color) goto LAB_01448c9d;
      pTVar9 = TPZCompEl::Reference(pTVar6);
      local_a0.super_TPZVec<long>.fStore[pTVar9->fIndex] = 1;
      lVar15 = lVar15 + 1;
    } while (lVar15 != lVar5);
  }
  lVar5 = (((this->super_TPZMHMeshControl).fPressureFineMesh.fRef)->fPointer->fElementVec).
          super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  if (0 < lVar5) {
    lVar15 = 0;
    do {
      ppTVar8 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(((this->super_TPZMHMeshControl).fPressureFineMesh.fRef)->fPointer->
                            fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,lVar15);
      pTVar6 = *ppTVar8;
      pTVar9 = TPZCompEl::Reference(pTVar6);
      if (local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_01448d50:
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMixedMeshControl.cpp"
                   ,0x569);
      }
      iVar2 = pTVar9->fMatId;
      p_Var7 = local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var14 = &p_Var1->_M_header;
      do {
        p_Var13 = p_Var14;
        p_Var11 = p_Var7;
        _Var3 = p_Var11[1]._M_color;
        p_Var14 = p_Var11;
        if ((int)_Var3 < iVar2) {
          p_Var14 = p_Var13;
        }
        p_Var7 = (&p_Var11->_M_left)[(int)_Var3 < iVar2];
      } while ((&p_Var11->_M_left)[(int)_Var3 < iVar2] != (_Base_ptr)0x0);
      if ((_Rb_tree_header *)p_Var14 == p_Var1) goto LAB_01448d50;
      if ((int)_Var3 < iVar2) {
        p_Var11 = p_Var13;
      }
      if (iVar2 < (int)p_Var11[1]._M_color) goto LAB_01448d50;
      pTVar9 = TPZCompEl::Reference(pTVar6);
      local_a0.super_TPZVec<long>.fStore[pTVar9->fIndex] = 1;
      lVar15 = lVar15 + 1;
    } while (lVar15 != lVar5);
  }
  lVar5 = (((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer->fElementVec).
          super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements;
  if (0 < lVar5) {
    lVar15 = 0;
    do {
      ppTVar10 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                           (&(((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer->fElementVec).
                             super_TPZChunkVector<TPZGeoEl_*,_10>,lVar15);
      if (local_a0.super_TPZVec<long>.fStore[lVar15] != 0) {
        for (pTVar9 = TPZGeoEl::Father(*ppTVar10); pTVar9 != (TPZGeoEl *)0x0;
            pTVar9 = TPZGeoEl::Father(pTVar9)) {
          if (local_a0.super_TPZVec<long>.fStore[pTVar9->fIndex] == 1) {
            local_a0.super_TPZVec<long>.fStore[pTVar9->fIndex] = 0;
          }
        }
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != lVar5);
  }
  TPZStack<long,_10>::TPZStack((TPZStack<long,_10> *)&local_118);
  if (0 < lVar5) {
    lVar15 = 0;
    do {
      if (local_a0.super_TPZVec<long>.fStore[lVar15] != 0) {
        TPZStack<long,_10>::Push((TPZStack<long,_10> *)&local_118,lVar15);
      }
      lVar15 = lVar15 + 1;
    } while (lVar5 != lVar15);
  }
  TPZMultiphysicsCompMesh::BuildMultiphysicsSpace
            (local_1c0,&local_188.super_TPZVec<TPZCompMesh_*>,&local_118.super_TPZVec<long>);
  TPZManVector<long,_10>::~TPZManVector(&local_118);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_1b8);
  TPZManVector<long,_10>::~TPZManVector(&local_a0);
  if (local_188.super_TPZVec<TPZCompMesh_*>.fStore != local_188.fExtAlloc) {
    local_188.super_TPZVec<TPZCompMesh_*>.fNAlloc = 0;
    local_188.super_TPZVec<TPZCompMesh_*>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_018144b0;
    if (local_188.super_TPZVec<TPZCompMesh_*>.fStore != (TPZCompMesh **)0x0) {
      operator_delete__(local_188.super_TPZVec<TPZCompMesh_*>.fStore);
    }
  }
  return;
}

Assistant:

void TPZMHMixedMeshControl::BuildMultiPhysicsMesh()
{
    if (fCMesh->NElements() != 0) {
        DebugStop();
    }
    fCMesh->SetAllCreateFunctionsMultiphysicElem();
    TPZMultiphysicsCompMesh *mphysics = dynamic_cast<TPZMultiphysicsCompMesh *>(fCMesh.operator->());
    int vecsize = 2;
    if(fNState > 1) vecsize = 3;
    TPZManVector<TPZCompMesh *> meshvec(vecsize);
    meshvec[0] = fFluxMesh.operator->();
    meshvec[1] = fPressureFineMesh.operator->();
    if(fNState > 1)
    {
        meshvec[2] = this->fRotationMesh.operator->();
    }
    TPZManVector<int64_t> shouldcreate(fGMesh->NElements(),0);
    std::set<int> matids;
    for (auto it : fCMesh->MaterialVec()) {
        matids.insert(it.first);
    }
    int64_t nel = fFluxMesh->NElements();
    for (int64_t el = 0; el<nel; el++) {
        TPZCompEl *cel = fFluxMesh->Element(el);
        TPZGeoEl *gel = cel->Reference();
        // this means that all geometric elements associated with flux elements will generate a computational element
        if (matids.find(gel->MaterialId()) == matids.end()) {
            DebugStop();
        }
        if (cel) {
            shouldcreate[cel->Reference()->Index()] = 1;
        }
    }
    nel = fPressureFineMesh->NElements();
    for (int64_t el=0; el<nel; el++) {
        TPZCompEl *cel = fPressureFineMesh->Element(el);
        TPZGeoEl *gel = cel->Reference();
        if (matids.find(gel->MaterialId()) == matids.end()) {
            DebugStop();
        }
        if (cel) {
            shouldcreate[cel->Reference()->Index()] = 1;
        }
    }
    // define the intersection of the finest references
    nel = fGMesh->NElements();
    for (int64_t el=0; el<nel; el++) {
        TPZGeoEl *gel = fGMesh->Element(el);
        if (shouldcreate[el])
        {
            TPZGeoEl *fat = gel->Father();
            while(fat)
            {
                if(shouldcreate[fat->Index()] == 1)
                {
                    shouldcreate[fat->Index()] = 0;
                }
                fat = fat->Father();
            }
        }
    }
    TPZStack<int64_t> gelindexes;
    for (int64_t el=0; el<nel; el++) {
        if (shouldcreate[el])
        {
            gelindexes.Push(el);
        }
    }
#ifdef PZ_LOG
    if(logger.isDebugEnabled())
    {
        std::stringstream sout;
        sout << "Geometric indices for which we will create multiphysics elements" << std::endl;
        sout << gelindexes;
//        std::cout << sout.str() << std::endl;
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    mphysics->BuildMultiphysicsSpace(meshvec,gelindexes);

}